

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseImpl.h
# Opt level: O1

void Eigen::internal::
     compute_inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *matrix,Matrix<double,_3,_3,_0,_3,_3> *result)

{
  ActualDstType actualDst;
  assign_op<double,_double> local_a1;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_a0;
  Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> local_58;
  
  PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix);
  if (local_a0.m_isInitialized != false) {
    Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::Inverse
              (&local_58,&local_a0);
    Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(result,&local_58,&local_a1);
    free(local_58.m_xpr.m_rowsTranspositions.m_indices.
         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_58.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_58.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    free(local_a0.m_rowsTranspositions.m_indices.
         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_a0.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_a0.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    return;
  }
  __assert_fail("m_isInitialized && \"PartialPivLU is not initialized.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/LU/PartialPivLU.h"
                ,0xc6,
                "const Inverse<PartialPivLU<MatrixType>> Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>::inverse() const [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const MatrixType& matrix, ResultType& result)
  {
    result = matrix.partialPivLu().inverse();
  }